

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

MultiNode<int,_int> * __thiscall
QHashPrivate::iterator<QHashPrivate::MultiNode<int,_int>_>::node
          (iterator<QHashPrivate::MultiNode<int,_int>_> *this)

{
  MultiNode<int,_int> *pMVar1;
  int __c;
  char *in_RSI;
  Span<QHashPrivate::MultiNode<int,_int>_> *in_RDI;
  size_t in_stack_ffffffffffffffd8;
  
  span((iterator<QHashPrivate::MultiNode<int,_int>_> *)in_RDI);
  index((iterator<QHashPrivate::MultiNode<int,_int>_> *)in_RDI,in_RSI,__c);
  pMVar1 = Span<QHashPrivate::MultiNode<int,_int>_>::at(in_RDI,in_stack_ffffffffffffffd8);
  return pMVar1;
}

Assistant:

inline Node *node() const noexcept
    {
        Q_ASSERT(!isUnused());
        return &d->spans[span()].at(index());
    }